

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_transform_kernel_pack8to1_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  int i;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined4 *puVar21;
  ulong uVar22;
  undefined4 *puVar23;
  void *pvVar24;
  undefined4 *puVar25;
  void *pvVar26;
  long lVar27;
  ulong uVar28;
  undefined4 *puVar29;
  undefined8 *puVar30;
  int k;
  long lVar31;
  int j;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  void *pvVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [32];
  float fVar48;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float tmp [8] [3];
  Mat local_e8;
  long local_a0;
  float fStack_98;
  undefined8 auStack_94 [3];
  undefined1 auStack_78 [72];
  
  uVar33 = (ulong)(uint)outch;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,0x40,inch,outch,4,(Allocator *)0x0);
  auVar15 = _DAT_0051b700;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar28 = 0;
    pvVar26 = local_e8.data;
    do {
      if (0 < inch) {
        iVar16 = inch * 9 * (int)uVar28;
        uVar34 = 0;
        pvVar24 = pvVar26;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar16 * 4 + 0x20);
          lVar35 = 0;
          do {
            auVar39 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_0051b880 + lVar35)),
                                    ZEXT416(*(uint *)((long)&DAT_0051b88c + lVar35)),0x10);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_0051b898 + lVar35)),0x20);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_0051b8a4 + lVar35)),0x30);
            auVar54 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_0051b884 + lVar35)),
                                    ZEXT416(*(uint *)((long)&DAT_0051b890 + lVar35)),0x10);
            auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)((long)&DAT_0051b89c + lVar35)),0x20);
            auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)((long)&DAT_0051b8a8 + lVar35)),0x30);
            fVar38 = auVar39._0_4_;
            fVar40 = auVar39._4_4_;
            fVar41 = auVar39._8_4_;
            fVar42 = auVar39._12_4_;
            fVar43 = auVar54._0_4_;
            fVar45 = auVar54._4_4_;
            fVar46 = auVar54._8_4_;
            fVar47 = auVar54._12_4_;
            auVar39 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_0051b888 + lVar35)),
                                    ZEXT416(*(uint *)((long)&DAT_0051b890 + lVar35 + 4)),0x10);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_0051b8a0 + lVar35)),0x20);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_0051b8ac + lVar35)),0x30);
            fVar48 = auVar39._0_4_;
            fVar51 = auVar39._4_4_;
            fVar52 = auVar39._8_4_;
            fVar53 = auVar39._12_4_;
            auVar54._0_4_ = fVar43 * fVar2 + fVar38 * fVar1 + fVar48 * fVar3;
            auVar54._4_4_ = fVar45 * fVar2 + fVar40 * fVar1 + fVar51 * fVar3;
            auVar54._8_4_ = fVar46 * fVar2 + fVar41 * fVar1 + fVar52 * fVar3;
            auVar54._12_4_ = fVar47 * fVar2 + fVar42 * fVar1 + fVar53 * fVar3;
            auVar55._0_4_ = fVar43 * fVar5 + fVar38 * fVar4 + fVar48 * fVar6;
            auVar55._4_4_ = fVar45 * fVar5 + fVar40 * fVar4 + fVar51 * fVar6;
            auVar55._8_4_ = fVar46 * fVar5 + fVar41 * fVar4 + fVar52 * fVar6;
            auVar55._12_4_ = fVar47 * fVar5 + fVar42 * fVar4 + fVar53 * fVar6;
            auVar39._0_8_ =
                 CONCAT44(fVar8 * fVar45 + fVar40 * fVar7 + fVar9 * fVar51,
                          fVar8 * fVar43 + fVar38 * fVar7 + fVar9 * fVar48);
            auVar39._8_4_ = fVar8 * fVar46 + fVar41 * fVar7 + fVar9 * fVar52;
            auVar39._12_4_ = fVar8 * fVar47 + fVar42 * fVar7 + fVar9 * fVar53;
            auVar44._16_16_ = auVar55;
            auVar44._0_16_ = auVar54;
            auVar50 = vpermilps_avx(auVar44,auVar15);
            auVar49._16_16_ = auVar54;
            auVar49._0_16_ = auVar55;
            auVar44 = vmovsldup_avx(auVar49);
            auVar44 = vblendps_avx(auVar50,auVar44,0x42);
            auVar50._8_8_ = auVar39._0_8_;
            auVar50._0_8_ = auVar39._0_8_;
            auVar50._16_16_ = auVar39;
            auVar44 = vblendps_avx(auVar44,auVar50,0x24);
            auVar54 = vshufps_avx(auVar54,auVar55,0xff);
            auVar39 = vshufpd_avx(auVar39,auVar39,3);
            auVar39 = vblendps_avx(auVar39,auVar54,6);
            *(undefined1 (*) [16])(auStack_78 + lVar35) = auVar39;
            *(undefined1 (*) [32])((long)auStack_94 + lVar35 + -4) = auVar44;
            lVar35 = lVar35 + 0x30;
          } while (lVar35 != 0x60);
          lVar35 = 0;
          pvVar36 = pvVar24;
          do {
            fVar1 = *(float *)((long)auStack_94 + lVar35 * 0xc + -4);
            uVar10 = *(undefined8 *)((long)auStack_94 + lVar35 * 0xc);
            puVar30 = (undefined8 *)&DAT_0051b884;
            lVar18 = 0;
            do {
              auVar37._0_4_ = (float)*puVar30 * (float)uVar10;
              auVar37._4_4_ = (float)((ulong)*puVar30 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar37._8_8_ = 0;
              auVar39 = vmovshdup_avx(auVar37);
              *(float *)((long)pvVar36 + lVar18 * 4) =
                   auVar37._0_4_ + fVar1 * *(float *)((long)puVar30 + -4) + auVar39._0_4_;
              lVar18 = lVar18 + 1;
              puVar30 = (undefined8 *)((long)puVar30 + 0xc);
            } while (lVar18 != 8);
            lVar35 = lVar35 + 1;
            pvVar36 = (void *)((long)pvVar36 + 0x20);
          } while (lVar35 != 8);
          uVar34 = uVar34 + 1;
          pvVar24 = (void *)((long)pvVar24 +
                            (long)local_e8.w *
                            CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar34 != (uint)inch);
      }
      uVar28 = uVar28 + 1;
      pvVar26 = (void *)((long)pvVar26 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar28 != uVar33);
  }
  uVar17 = outch + 7;
  if (-1 < outch) {
    uVar17 = outch;
  }
  Mat::create(kernel_tm_pack8,inch,0x40,(((int)uVar17 >> 3) - (uVar17 & 0xfffffff8)) + outch,0x20,8,
              (Allocator *)0x0);
  uVar28 = 0;
  if (7 < outch) {
    iVar16 = kernel_tm_pack8->w;
    pvVar11 = kernel_tm_pack8->data;
    sVar12 = kernel_tm_pack8->elemsize;
    local_a0 = kernel_tm_pack8->cstep * sVar12;
    uVar34 = 0;
    do {
      lVar18 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      lVar35 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      puVar23 = (undefined4 *)(lVar18 * uVar34 + (long)local_e8.data);
      lVar31 = 0;
      do {
        if (7 < inch) {
          lVar19 = (long)pvVar11 + (long)iVar16 * sVar12 * lVar31 + (uVar34 >> 3) * local_a0;
          puVar29 = puVar23;
          lVar32 = 0;
          do {
            lVar27 = 0;
            puVar25 = puVar29;
            do {
              lVar20 = lVar19;
              lVar19 = 0;
              puVar21 = puVar25;
              do {
                *(undefined4 *)(lVar20 + lVar19) = *puVar21;
                puVar21 = (undefined4 *)((long)puVar21 + lVar18);
                lVar19 = lVar19 + 4;
              } while (lVar19 != 0x20);
              lVar27 = lVar27 + 1;
              puVar25 = (undefined4 *)((long)puVar25 + lVar35);
              lVar19 = lVar20 + 0x20;
            } while (lVar27 != 8);
            lVar27 = lVar32 + 0xf;
            puVar29 = puVar29 + lVar35 * 2;
            lVar19 = lVar20 + 0x20;
            lVar32 = lVar32 + 8;
          } while (lVar27 < inch);
        }
        lVar31 = lVar31 + 1;
        puVar23 = puVar23 + 1;
      } while (lVar31 != 0x40);
      uVar28 = uVar34 + 8;
      uVar22 = uVar34 + 0xf;
      uVar34 = uVar28;
    } while (uVar22 < uVar33);
  }
  if ((int)uVar28 < outch) {
    iVar16 = kernel_tm_pack8->w;
    pvVar11 = kernel_tm_pack8->data;
    sVar12 = kernel_tm_pack8->elemsize;
    sVar13 = kernel_tm_pack8->cstep;
    uVar28 = uVar28 & 0xffffffff;
    lVar18 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
    puVar23 = (undefined4 *)(lVar18 * uVar28 + (long)local_e8.data);
    lVar35 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
    do {
      lVar31 = 0;
      puVar29 = puVar23;
      do {
        if (7 < inch) {
          lVar32 = (long)pvVar11 +
                   (long)iVar16 * sVar12 * lVar31 +
                   (ulong)(((uint)uVar28 & 7) + ((uint)(uVar28 >> 3) & 0x1fffffff)) *
                   sVar13 * sVar12;
          lVar19 = 0;
          puVar25 = puVar29;
          do {
            lVar27 = 0;
            puVar21 = puVar25;
            do {
              *(undefined4 *)(lVar32 + lVar27) = *puVar21;
              puVar21 = (undefined4 *)((long)puVar21 + lVar35);
              lVar27 = lVar27 + 4;
            } while (lVar27 != 0x20);
            lVar27 = lVar19 + 0xf;
            puVar25 = puVar25 + lVar35 * 2;
            lVar32 = lVar32 + 0x20;
            lVar19 = lVar19 + 8;
          } while (lVar27 < inch);
        }
        lVar31 = lVar31 + 1;
        puVar29 = puVar29 + 1;
      } while (lVar31 != 0x40);
      uVar28 = uVar28 + 1;
      puVar23 = (undefined4 *)((long)puVar23 + lVar18);
    } while (uVar28 != uVar33);
  }
  piVar14 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack8to1_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = 8a-inch/8a-64-outch;
    kernel_tm_pack8.create(8 * inch / 8, 64, outch / 8 + outch % 8, (size_t)4u * 8, 8);

    int p = 0;
    for (; p + 7 < outch; p += 8)
    {
        Mat g0 = kernel_tm_pack8.channel(p / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel_tm.channel(p + j).row(q + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack8.channel(p / 8 + p % 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    const float* k00 = k0.row(q + i);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}